

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionSet.cpp
# Opt level: O1

ostream * OpenMD::operator<<(ostream *os,SelectionSet *ss)

{
  ostream *poVar1;
  int i;
  long lVar2;
  long lVar3;
  
  lVar3 = 0;
  lVar2 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>(os,"SelectionSet[",0xd);
    poVar1 = (ostream *)std::ostream::operator<<(os,(int)lVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] = ",4);
    poVar1 = operator<<(poVar1,(OpenMDBitSet *)
                               ((long)&(((ss->bitsets_).
                                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                                       super__Bvector_base<std::allocator<bool>_> + lVar3));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    lVar2 = lVar2 + 1;
    lVar3 = lVar3 + 0x28;
  } while (lVar2 != 6);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const SelectionSet& ss) {
    for (int i = 0; i < N_SELECTIONTYPES; i++)
      os << "SelectionSet[" << i << "] = " << ss.bitsets_[i] << std::endl;
    return os;
  }